

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

void __thiscall llvm::detail::DoubleAPFloat::makeSmallestNormalized(DoubleAPFloat *this,bool Neg)

{
  anon_union_8_2_1313ab2f_for_U local_50;
  undefined4 local_48;
  Storage local_38;
  
  if (this->Semantics == (fltSemantics *)semPPCDoubleDouble) {
    local_48 = 0x40;
    local_50.pVal = (uint64_t *)0x360000000000000;
    APInt::clearUnusedBits((APInt *)&local_50);
    IEEEFloat::IEEEFloat(&local_38.IEEE,(fltSemantics *)semIEEEdouble,(APInt *)&local_50);
    APFloat::Storage::operator=
              ((Storage *)
               &(((this->Floats)._M_t.
                  super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
                  super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                  super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl)->U).IEEE,&local_38);
    APFloat::Storage::~Storage((Storage *)&local_38.IEEE);
    APInt::~APInt((APInt *)&local_50);
    if (Neg) {
      APFloat::changeSign((this->Floats)._M_t.
                          super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                          .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl);
    }
    APFloat::makeZero((this->Floats)._M_t.
                      super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                      .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl + 1,false);
    return;
  }
  __assert_fail("Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x1092,"void llvm::detail::DoubleAPFloat::makeSmallestNormalized(bool)");
}

Assistant:

void DoubleAPFloat::makeSmallestNormalized(bool Neg) {
  assert(Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  Floats[0] = APFloat(semIEEEdouble, APInt(64, 0x0360000000000000ull));
  if (Neg)
    Floats[0].changeSign();
  Floats[1].makeZero(/* Neg = */ false);
}